

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

void __thiscall
btMultiBody::forwardKinematics
          (btMultiBody *this,btAlignedObjectArray<btQuaternion> *world_to_local,
          btAlignedObjectArray<btVector3> *local_origin)

{
  int iVar1;
  int iVar2;
  int iVar3;
  btQuaternion *pbVar4;
  btQuaternion *pbVar5;
  btVector3 *pbVar6;
  btVector3 *pbVar7;
  btQuadWord *pbVar8;
  btAlignedObjectArray<btVector3> *in_RDX;
  btAlignedObjectArray<btVector3> *in_RSI;
  btMultiBody *in_RDI;
  btTransform tr;
  btScalar quat [4];
  btVector3 posr;
  int index;
  int link;
  int parent;
  int k;
  int nLinks;
  int i;
  btMatrix3x3 *rot_from_parent;
  int num_links;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  btVector3 *in_stack_fffffffffffffe38;
  btTransform *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  btMatrix3x3 *in_stack_fffffffffffffe50;
  btAlignedObjectArray<btVector3> *this_00;
  undefined4 in_stack_fffffffffffffe58;
  btAlignedObjectArray<btVector3> *rotation;
  btQuaternion *in_stack_fffffffffffffea8;
  btQuaternion *in_stack_fffffffffffffeb0;
  btVector3 local_110;
  int local_100;
  int local_fc;
  btQuadWord local_f8;
  btScalar local_e8 [4];
  undefined1 local_d8 [16];
  btQuadWord local_c8;
  int local_b8;
  int local_b4;
  btVector3 local_b0 [2];
  int local_90;
  btMatrix3x3 local_8c;
  int local_5c;
  btMatrix3x3 local_58;
  btMatrix3x3 *local_28;
  int local_1c;
  btAlignedObjectArray<btVector3> *local_18;
  btAlignedObjectArray<btVector3> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = getNumLinks((btMultiBody *)0x242821);
  local_28 = btAlignedObjectArray<btMatrix3x3>::operator[](&in_RDI->m_matrixBuf,0);
  btMatrix3x3::btMatrix3x3
            (in_stack_fffffffffffffe50,
             (btQuaternion *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  btMatrix3x3::operator=(local_28,&local_58);
  for (local_5c = 0; local_5c < local_1c; local_5c = local_5c + 1) {
    btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_5c);
    btMatrix3x3::btMatrix3x3
              (in_stack_fffffffffffffe50,
               (btQuaternion *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    btMatrix3x3::operator=(local_28 + (local_5c + 1),&local_8c);
  }
  local_90 = getNumLinks((btMultiBody *)0x2428fd);
  iVar1 = local_90 + 1;
  this_00 = local_10;
  btQuaternion::btQuaternion((btQuaternion *)0x24292c);
  btAlignedObjectArray<btQuaternion>::resize
            ((btAlignedObjectArray<btQuaternion> *)this_00,in_stack_fffffffffffffe4c,
             (btQuaternion *)in_stack_fffffffffffffe40);
  rotation = local_18;
  btVector3::btVector3(local_b0);
  btAlignedObjectArray<btVector3>::resize
            (this_00,in_stack_fffffffffffffe4c,(btVector3 *)in_stack_fffffffffffffe40);
  pbVar4 = getWorldToBaseRot(in_RDI);
  pbVar5 = btAlignedObjectArray<btQuaternion>::operator[]
                     ((btAlignedObjectArray<btQuaternion> *)local_10,0);
  *(undefined8 *)(pbVar5->super_btQuadWord).m_floats =
       *(undefined8 *)(pbVar4->super_btQuadWord).m_floats;
  *(undefined8 *)((pbVar5->super_btQuadWord).m_floats + 2) =
       *(undefined8 *)((pbVar4->super_btQuadWord).m_floats + 2);
  pbVar6 = getBasePos(in_RDI);
  pbVar7 = btAlignedObjectArray<btVector3>::operator[](local_18,0);
  *(undefined8 *)pbVar7->m_floats = *(undefined8 *)pbVar6->m_floats;
  *(undefined8 *)(pbVar7->m_floats + 2) = *(undefined8 *)(pbVar6->m_floats + 2);
  local_b4 = 0;
  while( true ) {
    iVar3 = local_b4;
    iVar2 = getNumLinks((btMultiBody *)0x242a02);
    if (iVar2 <= iVar3) break;
    local_b8 = getParent((btMultiBody *)
                         CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         in_stack_fffffffffffffe2c);
    in_stack_fffffffffffffe38 =
         (btVector3 *)
         getParentToLocalRot((btMultiBody *)
                             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                             in_stack_fffffffffffffe2c);
    btAlignedObjectArray<btQuaternion>::operator[]
              ((btAlignedObjectArray<btQuaternion> *)local_10,local_b8 + 1);
    local_c8.m_floats =
         (btScalar  [4])::operator*(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    pbVar4 = btAlignedObjectArray<btQuaternion>::operator[]
                       ((btAlignedObjectArray<btQuaternion> *)local_10,local_b4 + 1);
    *(undefined8 *)(pbVar4->super_btQuadWord).m_floats = local_c8.m_floats._0_8_;
    *(undefined8 *)((pbVar4->super_btQuadWord).m_floats + 2) = local_c8.m_floats._8_8_;
    in_stack_fffffffffffffe40 =
         (btTransform *)btAlignedObjectArray<btVector3>::operator[](local_18,local_b8 + 1);
    btAlignedObjectArray<btQuaternion>::operator[]
              ((btAlignedObjectArray<btQuaternion> *)local_10,local_b4 + 1);
    local_f8.m_floats =
         (btScalar  [4])
         btQuaternion::inverse
                   ((btQuaternion *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    getRVector((btMultiBody *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c);
    local_e8 = (btScalar  [4])
               quatRotate((btQuaternion *)rotation,
                          (btVector3 *)CONCAT44(iVar1,in_stack_fffffffffffffe58));
    local_d8 = (undefined1  [16])
               operator+((btVector3 *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    pbVar6 = btAlignedObjectArray<btVector3>::operator[](local_18,local_b4 + 1);
    *(undefined8 *)pbVar6->m_floats = local_d8._0_8_;
    *(undefined8 *)(pbVar6->m_floats + 2) = local_d8._8_8_;
    local_b4 = local_b4 + 1;
  }
  local_fc = 0;
  while( true ) {
    iVar1 = local_fc;
    iVar3 = getNumLinks((btMultiBody *)0x242b9a);
    if (iVar3 <= iVar1) break;
    local_100 = local_fc + 1;
    pbVar6 = btAlignedObjectArray<btVector3>::operator[](local_18,local_100);
    local_110.m_floats._0_8_ = *(undefined8 *)pbVar6->m_floats;
    local_110.m_floats._8_8_ = *(undefined8 *)(pbVar6->m_floats + 2);
    pbVar8 = &btAlignedObjectArray<btQuaternion>::operator[]
                        ((btAlignedObjectArray<btQuaternion> *)local_10,local_100)->super_btQuadWord
    ;
    btQuadWord::x(pbVar8);
    pbVar8 = &btAlignedObjectArray<btQuaternion>::operator[]
                        ((btAlignedObjectArray<btQuaternion> *)local_10,local_100)->super_btQuadWord
    ;
    btQuadWord::y(pbVar8);
    pbVar8 = &btAlignedObjectArray<btQuaternion>::operator[]
                        ((btAlignedObjectArray<btQuaternion> *)local_10,local_100)->super_btQuadWord
    ;
    btQuadWord::z(pbVar8);
    pbVar8 = &btAlignedObjectArray<btQuaternion>::operator[]
                        ((btAlignedObjectArray<btQuaternion> *)local_10,local_100)->super_btQuadWord
    ;
    btQuadWord::w(pbVar8);
    btTransform::btTransform((btTransform *)CONCAT44(iVar1,in_stack_fffffffffffffe30));
    btTransform::setIdentity(in_stack_fffffffffffffe40);
    btTransform::setOrigin((btTransform *)&stack0xfffffffffffffe98,&local_110);
    btQuaternion::btQuaternion
              ((btQuaternion *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38->m_floats,
               (btScalar *)CONCAT44(iVar1,in_stack_fffffffffffffe30),
               (btScalar *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (btScalar *)0x242d0b);
    btTransform::setRotation
              ((btTransform *)CONCAT44(iVar1,in_stack_fffffffffffffe30),
               (btQuaternion *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    getLink((btMultiBody *)CONCAT44(iVar1,in_stack_fffffffffffffe30),in_stack_fffffffffffffe2c);
    btTransform::operator=
              ((btTransform *)CONCAT44(iVar1,in_stack_fffffffffffffe30),
               (btTransform *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_fc = local_fc + 1;
  }
  return;
}

Assistant:

void	btMultiBody::forwardKinematics(btAlignedObjectArray<btQuaternion>& world_to_local,btAlignedObjectArray<btVector3>& local_origin)
{
	
	int num_links = getNumLinks();

	// Cached 3x3 rotation matrices from parent frame to this frame.
	btMatrix3x3* rot_from_parent =(btMatrix3x3 *) &m_matrixBuf[0];

	rot_from_parent[0] = btMatrix3x3(m_baseQuat);				//m_baseQuat assumed to be alias!?
	
	for (int i = 0; i < num_links; ++i) 
	{
		rot_from_parent[i+1] = btMatrix3x3(m_links[i].m_cachedRotParentToThis);
	}
		
	int nLinks = getNumLinks();
	///base + num m_links
	world_to_local.resize(nLinks+1);
	local_origin.resize(nLinks+1);

	world_to_local[0] = getWorldToBaseRot();
	local_origin[0] = getBasePos();
	
	for (int k=0;k<getNumLinks();k++)
	{
		const int parent = getParent(k);
		world_to_local[k+1] = getParentToLocalRot(k) * world_to_local[parent+1];
		local_origin[k+1] = local_origin[parent+1] + (quatRotate(world_to_local[k+1].inverse() , getRVector(k)));
	}

	for (int link=0;link<getNumLinks();link++)
	{
		int index = link+1;

		btVector3 posr = local_origin[index];
		btScalar quat[4]={-world_to_local[index].x(),-world_to_local[index].y(),-world_to_local[index].z(),world_to_local[index].w()};
		btTransform tr;
		tr.setIdentity();
		tr.setOrigin(posr);
		tr.setRotation(btQuaternion(quat[0],quat[1],quat[2],quat[3]));
		getLink(link).m_cachedWorldTransform = tr;
			
	}

}